

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void write_buffer_8x8(__m128i *res,int32_t *output)

{
  longlong lVar1;
  
  lVar1 = (*res)[1];
  *(longlong *)output = (*res)[0];
  *(longlong *)(output + 2) = lVar1;
  lVar1 = res[1][1];
  *(longlong *)(output + 4) = res[1][0];
  *(longlong *)(output + 6) = lVar1;
  lVar1 = res[2][1];
  *(longlong *)(output + 8) = res[2][0];
  *(longlong *)(output + 10) = lVar1;
  lVar1 = res[3][1];
  *(longlong *)(output + 0xc) = res[3][0];
  *(longlong *)(output + 0xe) = lVar1;
  lVar1 = res[4][1];
  *(longlong *)(output + 0x10) = res[4][0];
  *(longlong *)(output + 0x12) = lVar1;
  lVar1 = res[5][1];
  *(longlong *)(output + 0x14) = res[5][0];
  *(longlong *)(output + 0x16) = lVar1;
  lVar1 = res[6][1];
  *(longlong *)(output + 0x18) = res[6][0];
  *(longlong *)(output + 0x1a) = lVar1;
  lVar1 = res[7][1];
  *(longlong *)(output + 0x1c) = res[7][0];
  *(longlong *)(output + 0x1e) = lVar1;
  lVar1 = res[8][1];
  *(longlong *)(output + 0x20) = res[8][0];
  *(longlong *)(output + 0x22) = lVar1;
  lVar1 = res[9][1];
  *(longlong *)(output + 0x24) = res[9][0];
  *(longlong *)(output + 0x26) = lVar1;
  lVar1 = res[10][1];
  *(longlong *)(output + 0x28) = res[10][0];
  *(longlong *)(output + 0x2a) = lVar1;
  lVar1 = res[0xb][1];
  *(longlong *)(output + 0x2c) = res[0xb][0];
  *(longlong *)(output + 0x2e) = lVar1;
  lVar1 = res[0xc][1];
  *(longlong *)(output + 0x30) = res[0xc][0];
  *(longlong *)(output + 0x32) = lVar1;
  lVar1 = res[0xd][1];
  *(longlong *)(output + 0x34) = res[0xd][0];
  *(longlong *)(output + 0x36) = lVar1;
  lVar1 = res[0xe][1];
  *(longlong *)(output + 0x38) = res[0xe][0];
  *(longlong *)(output + 0x3a) = lVar1;
  lVar1 = res[0xf][1];
  *(longlong *)(output + 0x3c) = res[0xf][0];
  *(longlong *)(output + 0x3e) = lVar1;
  return;
}

Assistant:

static inline void write_buffer_8x8(const __m128i *res, int32_t *output) {
  _mm_store_si128((__m128i *)(output + 0 * 4), res[0]);
  _mm_store_si128((__m128i *)(output + 1 * 4), res[1]);
  _mm_store_si128((__m128i *)(output + 2 * 4), res[2]);
  _mm_store_si128((__m128i *)(output + 3 * 4), res[3]);

  _mm_store_si128((__m128i *)(output + 4 * 4), res[4]);
  _mm_store_si128((__m128i *)(output + 5 * 4), res[5]);
  _mm_store_si128((__m128i *)(output + 6 * 4), res[6]);
  _mm_store_si128((__m128i *)(output + 7 * 4), res[7]);

  _mm_store_si128((__m128i *)(output + 8 * 4), res[8]);
  _mm_store_si128((__m128i *)(output + 9 * 4), res[9]);
  _mm_store_si128((__m128i *)(output + 10 * 4), res[10]);
  _mm_store_si128((__m128i *)(output + 11 * 4), res[11]);

  _mm_store_si128((__m128i *)(output + 12 * 4), res[12]);
  _mm_store_si128((__m128i *)(output + 13 * 4), res[13]);
  _mm_store_si128((__m128i *)(output + 14 * 4), res[14]);
  _mm_store_si128((__m128i *)(output + 15 * 4), res[15]);
}